

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

string * __thiscall
soul::Structure::addMemberWithUniqueName
          (string *__return_storage_ptr__,Structure *this,Type *type,string *memberName)

{
  bool bVar1;
  int __val;
  string_view memberName_00;
  allocator<char> local_f9;
  size_type local_f8;
  Type *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  Type local_a8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = memberName->_M_string_length;
  local_f0 = type;
  if (local_f8 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"temp",&local_f9);
  }
  else {
    std::__cxx11::string::string((string *)&local_e8,(string *)memberName);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_e8);
  __val = 2;
  while( true ) {
    memberName_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    memberName_00._M_len = __return_storage_ptr__->_M_string_length;
    bVar1 = hasMemberWithName(this,memberName_00);
    if (!bVar1) break;
    std::operator+(&local_70,&local_e8,"_");
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    __val = __val + 1;
  }
  std::__cxx11::string::~string((string *)&local_e8);
  local_a8.category = local_f0->category;
  local_a8.arrayElementCategory = local_f0->arrayElementCategory;
  local_a8.isRef = local_f0->isRef;
  local_a8.isConstant = local_f0->isConstant;
  local_a8.primitiveType.type = (local_f0->primitiveType).type;
  local_a8.boundingSize = local_f0->boundingSize;
  local_a8.arrayElementBoundingSize = local_f0->arrayElementBoundingSize;
  local_a8.structure.object = (local_f0->structure).object;
  (local_f0->structure).object = (Structure *)0x0;
  std::__cxx11::string::string((string *)&local_c8,(string *)__return_storage_ptr__);
  addMember(this,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_a8.structure);
  return __return_storage_ptr__;
}

Assistant:

std::string Structure::addMemberWithUniqueName (Type type, const std::string& memberName)
{
    auto newName = addSuffixToMakeUnique (memberName.empty() ? "temp" : memberName,
                                          [this] (const std::string& nm) { return hasMemberWithName (nm); });
    addMember (std::move (type), newName);
    return newName;
}